

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O3

void __thiscall xray_re::xr_packet::r_sz(xr_packet *this,string *value)

{
  uint8_t *puVar1;
  size_t sVar2;
  pointer pcVar3;
  uint8_t *puVar4;
  size_t sVar5;
  
  sVar2 = this->m_r_pos;
  puVar4 = this->m_buf + (sVar2 - 1);
  sVar5 = sVar2;
  do {
    if (0xfff < sVar5) {
      __assert_fail("m_r_pos < sizeof(m_buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_packet.cxx"
                    ,0x5d,"void xray_re::xr_packet::r_sz(std::string &)");
    }
    sVar5 = sVar5 + 1;
    this->m_r_pos = sVar5;
    puVar1 = puVar4 + 1;
    puVar4 = puVar4 + 1;
  } while (*puVar1 != '\0');
  pcVar3 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_replace_dispatch<unsigned_char*>
            ((string *)value,pcVar3,pcVar3 + value->_M_string_length,this->m_buf + sVar2);
  return;
}

Assistant:

void xr_packet::r_sz(std::string& value)
{
	uint8_t* p = &m_buf[m_r_pos];
	while (m_r_pos < sizeof(m_buf)) {
		if (m_buf[m_r_pos++] == 0) {
			value.assign(p, &m_buf[m_r_pos - 1]);
			return;
		}
	}
	// crash in debug mode if no 0 in the packet
	assert(m_r_pos < sizeof(m_buf));
	value.assign(p, m_buf + m_r_pos);
}